

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void glsl_texld(Context *ctx,int texldd)

{
  byte bVar1;
  int iVar2;
  RegisterList *item;
  RegisterList *pRVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *fmt;
  uint uVar8;
  size_t len_00;
  byte bVar9;
  size_t in_R8;
  int iVar10;
  char *pcVar11;
  RegisterList *item_1;
  bool bVar12;
  char swiz_str [6];
  char dst [64];
  char code [128];
  char regnum_str [16];
  char sampler [64];
  char bias [64];
  char src3 [64];
  size_t len;
  
  bVar1 = ctx->major_ver;
  len_00 = (ulong)bVar1 << 0x10;
  bVar9 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar9 = ctx->minor_ver;
  }
  uVar5 = (uint)bVar9 | (uint)bVar1 << 0x10;
  len = (size_t)uVar5;
  if (uVar5 < 0x10004) {
    code[0x70] = '\0';
    code[0x71] = '\0';
    code[0x72] = '\0';
    code[0x73] = '\0';
    code[0x74] = '\0';
    code[0x75] = '\0';
    code[0x76] = '\0';
    code[0x77] = '\0';
    code[0x78] = '\0';
    code[0x79] = '\0';
    code[0x7a] = '\0';
    code[0x7b] = '\0';
    code[0x7c] = '\0';
    code[0x7d] = '\0';
    code[0x7e] = '\0';
    code[0x7f] = '\0';
    code[0x60] = '\0';
    code[0x61] = '\0';
    code[0x62] = '\0';
    code[99] = '\0';
    code[100] = '\0';
    code[0x65] = '\0';
    code[0x66] = '\0';
    code[0x67] = '\0';
    code[0x68] = '\0';
    code[0x69] = '\0';
    code[0x6a] = '\0';
    code[0x6b] = '\0';
    code[0x6c] = '\0';
    code[0x6d] = '\0';
    code[0x6e] = '\0';
    code[0x6f] = '\0';
    code[0x50] = '\0';
    code[0x51] = '\0';
    code[0x52] = '\0';
    code[0x53] = '\0';
    code[0x54] = '\0';
    code[0x55] = '\0';
    code[0x56] = '\0';
    code[0x57] = '\0';
    code[0x58] = '\0';
    code[0x59] = '\0';
    code[0x5a] = '\0';
    code[0x5b] = '\0';
    code[0x5c] = '\0';
    code[0x5d] = '\0';
    code[0x5e] = '\0';
    code[0x5f] = '\0';
    code[0x40] = '\0';
    code[0x41] = '\0';
    code[0x42] = '\0';
    code[0x43] = '\0';
    code[0x44] = '\0';
    code[0x45] = '\0';
    code[0x46] = '\0';
    code[0x47] = '\0';
    code[0x48] = '\0';
    code[0x49] = '\0';
    code[0x4a] = '\0';
    code[0x4b] = '\0';
    code[0x4c] = '\0';
    code[0x4d] = '\0';
    code[0x4e] = '\0';
    code[0x4f] = '\0';
    code[0x30] = '\0';
    code[0x31] = '\0';
    code[0x32] = '\0';
    code[0x33] = '\0';
    code[0x34] = '\0';
    code[0x35] = '\0';
    code[0x36] = '\0';
    code[0x37] = '\0';
    code[0x38] = '\0';
    code[0x39] = '\0';
    code[0x3a] = '\0';
    code[0x3b] = '\0';
    code[0x3c] = '\0';
    code[0x3d] = '\0';
    code[0x3e] = '\0';
    code[0x3f] = '\0';
    code[0x20] = '\0';
    code[0x21] = '\0';
    code[0x22] = '\0';
    code[0x23] = '\0';
    code[0x24] = '\0';
    code[0x25] = '\0';
    code[0x26] = '\0';
    code[0x27] = '\0';
    code[0x28] = '\0';
    code[0x29] = '\0';
    code[0x2a] = '\0';
    code[0x2b] = '\0';
    code[0x2c] = '\0';
    code[0x2d] = '\0';
    code[0x2e] = '\0';
    code[0x2f] = '\0';
    code[0x10] = '\0';
    code[0x11] = '\0';
    code[0x12] = '\0';
    code[0x13] = '\0';
    code[0x14] = '\0';
    code[0x15] = '\0';
    code[0x16] = '\0';
    code[0x17] = '\0';
    code[0x18] = '\0';
    code[0x19] = '\0';
    code[0x1a] = '\0';
    code[0x1b] = '\0';
    code[0x1c] = '\0';
    code[0x1d] = '\0';
    code[0x1e] = '\0';
    code[0x1f] = '\0';
    code[0] = '\0';
    code[1] = '\0';
    code[2] = '\0';
    code[3] = '\0';
    code[4] = '\0';
    code[5] = '\0';
    code[6] = '\0';
    code[7] = '\0';
    code[8] = '\0';
    code[9] = '\0';
    code[10] = '\0';
    code[0xb] = '\0';
    code[0xc] = '\0';
    code[0xd] = '\0';
    code[0xe] = '\0';
    code[0xf] = '\0';
    if (texldd != 0) {
      __assert_fail("!texldd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0xd3d,"void glsl_texld(Context *, const int)");
    }
    pRVar3 = (ctx->samplers).next;
    uVar5 = 0;
    if (pRVar3 != (RegisterList *)0x0) {
      uVar6 = (ctx->dest_arg).regnum | 0xa0000;
      while( true ) {
        uVar8 = pRVar3->regtype << 0x10 | pRVar3->regnum;
        len_00 = (size_t)uVar8;
        if (uVar6 == uVar8) break;
        uVar5 = 0;
        if ((uVar6 < uVar8) || (pRVar3 = pRVar3->next, pRVar3 == (RegisterList *)0x0))
        goto LAB_0011e4d9;
      }
      uVar5 = pRVar3->index;
    }
LAB_0011e4d9:
    get_GLSL_destarg_varname(ctx,dst,len_00);
    snprintf(regnum_str,0x10,"%u",(ulong)(uint)(ctx->dest_arg).regnum);
    snprintf(sampler,0x40,"%s_%s%s",ctx->shader_type_str,"s",regnum_str);
    if (uVar5 == 4) {
      pcVar7 = "texture3D(%s, %s.xyz)";
    }
    else if (uVar5 == 3) {
      pcVar7 = "textureCube(%s, %s.xyz)";
    }
    else {
      if (uVar5 != 2) {
        failf(ctx,"%s","unexpected texture type");
        goto LAB_0011e725;
      }
      pcVar7 = "texture2D(%s, %s.xy)";
    }
    make_GLSL_destarg_assign(ctx,code,0x80,pcVar7,sampler,dst);
    goto LAB_0011e725;
  }
  if (bVar1 < 2) {
    failf(ctx,"%s","TEXLD == Shader Model 1.4 unimplemented.");
    return;
  }
  pRVar3 = (ctx->samplers).next;
  if (pRVar3 != (RegisterList *)0x0) {
    uVar5 = ctx->source_args[1].regnum | 0xa0000;
    do {
      uVar6 = pRVar3->regtype << 0x10 | pRVar3->regnum;
      len = (size_t)uVar6;
      if (uVar5 == uVar6) goto LAB_0011e3ba;
    } while ((uVar6 <= uVar5) && (pRVar3 = pRVar3->next, pRVar3 != (RegisterList *)0x0));
  }
  pRVar3 = (RegisterList *)0x0;
LAB_0011e3ba:
  dst[0x30] = '\0';
  dst[0x31] = '\0';
  dst[0x32] = '\0';
  dst[0x33] = '\0';
  dst[0x34] = '\0';
  dst[0x35] = '\0';
  dst[0x36] = '\0';
  dst[0x37] = '\0';
  dst[0x38] = '\0';
  dst[0x39] = '\0';
  dst[0x3a] = '\0';
  dst[0x3b] = '\0';
  dst[0x3c] = '\0';
  dst[0x3d] = '\0';
  dst[0x3e] = '\0';
  dst[0x3f] = '\0';
  dst[0x20] = '\0';
  dst[0x21] = '\0';
  dst[0x22] = '\0';
  dst[0x23] = '\0';
  dst[0x24] = '\0';
  dst[0x25] = '\0';
  dst[0x26] = '\0';
  dst[0x27] = '\0';
  dst[0x28] = '\0';
  dst[0x29] = '\0';
  dst[0x2a] = '\0';
  dst[0x2b] = '\0';
  dst[0x2c] = '\0';
  dst[0x2d] = '\0';
  dst[0x2e] = '\0';
  dst[0x2f] = '\0';
  dst[0x10] = '\0';
  dst[0x11] = '\0';
  dst[0x12] = '\0';
  dst[0x13] = '\0';
  dst[0x14] = '\0';
  dst[0x15] = '\0';
  dst[0x16] = '\0';
  dst[0x17] = '\0';
  dst[0x18] = '\0';
  dst[0x19] = '\0';
  dst[0x1a] = '\0';
  dst[0x1b] = '\0';
  dst[0x1c] = '\0';
  dst[0x1d] = '\0';
  dst[0x1e] = '\0';
  dst[0x1f] = '\0';
  dst[0] = '\0';
  dst[1] = '\0';
  dst[2] = '\0';
  dst[3] = '\0';
  dst[4] = '\0';
  dst[5] = '\0';
  dst[6] = '\0';
  dst[7] = '\0';
  dst[8] = '\0';
  dst[9] = '\0';
  dst[10] = '\0';
  dst[0xb] = '\0';
  dst[0xc] = '\0';
  dst[0xd] = '\0';
  dst[0xe] = '\0';
  dst[0xf] = '\0';
  get_GLSL_srcarg_varname(ctx,1,sampler,len);
  regnum_str[0] = '\0';
  regnum_str[1] = '\0';
  regnum_str[2] = '\0';
  regnum_str[3] = '\0';
  regnum_str[4] = '\0';
  regnum_str[5] = '\0';
  regnum_str[6] = '\0';
  regnum_str[7] = '\0';
  regnum_str[8] = '\0';
  regnum_str[9] = '\0';
  regnum_str[10] = '\0';
  regnum_str[0xb] = '\0';
  regnum_str[0xc] = '\0';
  regnum_str[0xd] = '\0';
  regnum_str[0xe] = '\0';
  regnum_str[0xf] = '\0';
  src3[0x30] = '\0';
  src3[0x31] = '\0';
  src3[0x32] = '\0';
  src3[0x33] = '\0';
  src3[0x34] = '\0';
  src3[0x35] = '\0';
  src3[0x36] = '\0';
  src3[0x37] = '\0';
  src3[0x38] = '\0';
  src3[0x39] = '\0';
  src3[0x3a] = '\0';
  src3[0x3b] = '\0';
  src3[0x3c] = '\0';
  src3[0x3d] = '\0';
  src3[0x3e] = '\0';
  src3[0x3f] = '\0';
  src3[0x20] = '\0';
  src3[0x21] = '\0';
  src3[0x22] = '\0';
  src3[0x23] = '\0';
  src3[0x24] = '\0';
  src3[0x25] = '\0';
  src3[0x26] = '\0';
  src3[0x27] = '\0';
  src3[0x28] = '\0';
  src3[0x29] = '\0';
  src3[0x2a] = '\0';
  src3[0x2b] = '\0';
  src3[0x2c] = '\0';
  src3[0x2d] = '\0';
  src3[0x2e] = '\0';
  src3[0x2f] = '\0';
  src3[0x10] = '\0';
  src3[0x11] = '\0';
  src3[0x12] = '\0';
  src3[0x13] = '\0';
  src3[0x14] = '\0';
  src3[0x15] = '\0';
  src3[0x16] = '\0';
  src3[0x17] = '\0';
  src3[0x18] = '\0';
  src3[0x19] = '\0';
  src3[0x1a] = '\0';
  src3[0x1b] = '\0';
  src3[0x1c] = '\0';
  src3[0x1d] = '\0';
  src3[0x1e] = '\0';
  src3[0x1f] = '\0';
  src3[0] = '\0';
  src3[1] = '\0';
  src3[2] = '\0';
  src3[3] = '\0';
  src3[4] = '\0';
  src3[5] = '\0';
  src3[6] = '\0';
  src3[7] = '\0';
  src3[8] = '\0';
  src3[9] = '\0';
  src3[10] = '\0';
  src3[0xb] = '\0';
  src3[0xc] = '\0';
  src3[0xd] = '\0';
  src3[0xe] = '\0';
  src3[0xf] = '\0';
  if (pRVar3 == (RegisterList *)0x0) {
    pcVar7 = "TEXLD using undeclared sampler";
LAB_0011e75b:
    failf(ctx,"%s",pcVar7);
    return;
  }
  if (texldd != 0) {
    uVar5 = pRVar3->index - 2;
    if (2 < uVar5) {
      __assert_fail("(sreg->index == TEXTURE_TYPE_CUBE) || (sreg->index == TEXTURE_TYPE_VOLUME)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0xd82,"void glsl_texld(Context *, const int)");
    }
    iVar10 = *(int *)(&DAT_00126dd8 + (ulong)uVar5 * 4);
    make_GLSL_srcarg_string(ctx,2,iVar10,regnum_str,in_R8);
    make_GLSL_srcarg_string(ctx,3,iVar10,src3,in_R8);
  }
  bias[0x30] = '\0';
  bias[0x31] = '\0';
  bias[0x32] = '\0';
  bias[0x33] = '\0';
  bias[0x34] = '\0';
  bias[0x35] = '\0';
  bias[0x36] = '\0';
  bias[0x37] = '\0';
  bias[0x38] = '\0';
  bias[0x39] = '\0';
  bias[0x3a] = '\0';
  bias[0x3b] = '\0';
  bias[0x3c] = '\0';
  bias[0x3d] = '\0';
  bias[0x3e] = '\0';
  bias[0x3f] = '\0';
  bias[0x20] = '\0';
  bias[0x21] = '\0';
  bias[0x22] = '\0';
  bias[0x23] = '\0';
  bias[0x24] = '\0';
  bias[0x25] = '\0';
  bias[0x26] = '\0';
  bias[0x27] = '\0';
  bias[0x28] = '\0';
  bias[0x29] = '\0';
  bias[0x2a] = '\0';
  bias[0x2b] = '\0';
  bias[0x2c] = '\0';
  bias[0x2d] = '\0';
  bias[0x2e] = '\0';
  bias[0x2f] = '\0';
  bias[0x10] = '\0';
  bias[0x11] = '\0';
  bias[0x12] = '\0';
  bias[0x13] = '\0';
  bias[0x14] = '\0';
  bias[0x15] = '\0';
  bias[0x16] = '\0';
  bias[0x17] = '\0';
  bias[0x18] = '\0';
  bias[0x19] = '\0';
  bias[0x1a] = '\0';
  bias[0x1b] = '\0';
  bias[0x1c] = '\0';
  bias[0x1d] = '\0';
  bias[0x1e] = '\0';
  bias[0x1f] = '\0';
  bias[0] = '\0';
  bias[1] = '\0';
  bias[2] = '\0';
  bias[3] = '\0';
  bias[4] = '\0';
  bias[5] = '\0';
  bias[6] = '\0';
  bias[7] = '\0';
  bias[8] = '\0';
  bias[9] = '\0';
  bias[10] = '\0';
  bias[0xb] = '\0';
  bias[0xc] = '\0';
  bias[0xd] = '\0';
  bias[0xe] = '\0';
  bias[0xf] = '\0';
  if (ctx->instruction_controls == 2) {
    make_GLSL_srcarg_string(ctx,0,8,bias,in_R8);
    pcVar7 = ", ";
  }
  else {
    pcVar7 = "";
  }
  uVar5 = pRVar3->index;
  if (uVar5 == 4) {
    bVar12 = ctx->instruction_controls == 1;
    iVar10 = (uint)bVar12 * 8 + 7;
    pcVar4 = "texture3DProj";
    pcVar11 = "texture3D";
LAB_0011e64a:
    if (bVar12) {
      pcVar11 = pcVar4;
    }
  }
  else {
    if (uVar5 != 3) {
      if (uVar5 != 2) {
        pcVar7 = "unknown texture type";
        goto LAB_0011e75b;
      }
      bVar12 = ctx->instruction_controls == 1;
      iVar10 = 3;
      if (bVar12) {
        iVar10 = 0xf;
      }
      pcVar4 = "texture2DProj";
      pcVar11 = "texture2D";
      goto LAB_0011e64a;
    }
    pcVar11 = "textureCube";
    iVar10 = 7;
    if (ctx->instruction_controls == 1) {
      failf(ctx,"%s","TEXLDP on a cubemap");
    }
  }
  make_GLSL_srcarg_string(ctx,0,iVar10,dst,in_R8);
  iVar10 = ctx->source_args[1].regnum;
  iVar2 = isscalar(ctx,ctx->shader_type,ctx->source_args[1].regtype,iVar10);
  if (iVar2 != 0) {
    __assert_fail("!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0xdb7,"void glsl_texld(Context *, const int)");
  }
  swiz_str[4] = '\0';
  swiz_str[5] = '\0';
  swiz_str[0] = '\0';
  swiz_str[1] = '\0';
  swiz_str[2] = '\0';
  swiz_str[3] = '\0';
  make_GLSL_swizzle_string
            (swiz_str,(ulong)(uint)ctx->source_args[1].swizzle,(ctx->dest_arg).writemask,iVar10);
  if (texldd == 0) {
    pcVar4 = bias;
    fmt = "%s(%s, %s%s%s)%s";
  }
  else {
    pcVar4 = src3;
    pcVar7 = regnum_str;
    fmt = "%sGrad(%s, %s, %s, %s)%s";
  }
  make_GLSL_destarg_assign(ctx,code,0x80,fmt,pcVar11,sampler,dst,pcVar7,pcVar4,swiz_str);
LAB_0011e725:
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void glsl_texld(Context *ctx, const int texldd)
{
    if (!shader_version_atleast(ctx, 1, 4))
    {
        DestArgInfo *info = &ctx->dest_arg;
        char dst[64];
        char sampler[64];
        char code[128] = {0};

        assert(!texldd);

        RegisterList *sreg;
        sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, info->regnum);
        const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

        // !!! FIXME: this code counts on the register not having swizzles, etc.
        get_GLSL_destarg_varname(ctx, dst, sizeof (dst));
        get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                                sampler, sizeof (sampler));

        if (ttype == TEXTURE_TYPE_2D)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "texture2D(%s, %s.xy)",
                                     sampler, dst);
        }
        else if (ttype == TEXTURE_TYPE_CUBE)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "textureCube(%s, %s.xyz)",
                                     sampler, dst);
        }
        else if (ttype == TEXTURE_TYPE_VOLUME)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "texture3D(%s, %s.xyz)",
                                     sampler, dst);
        }
        else
        {
            fail(ctx, "unexpected texture type");
        } // else
        output_line(ctx, "%s", code);
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // else if

    else
    {
        const SourceArgInfo *samp_arg = &ctx->source_args[1];
        RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                          samp_arg->regnum);
        const char *funcname = NULL;
        char src0[64] = { '\0' };
        char src1[64]; get_GLSL_srcarg_varname(ctx, 1, src1, sizeof (src1)); // !!! FIXME: SRC_MOD?
        char src2[64] = { '\0' };
        char src3[64] = { '\0' };

        if (sreg == NULL)
        {
            fail(ctx, "TEXLD using undeclared sampler");
            return;
        } // if

        if (texldd)
        {
            if (sreg->index == TEXTURE_TYPE_2D)
            {
                make_GLSL_srcarg_string_vec2(ctx, 2, src2, sizeof (src2));
                make_GLSL_srcarg_string_vec2(ctx, 3, src3, sizeof (src3));
            } // if
            else
            {
                assert((sreg->index == TEXTURE_TYPE_CUBE) || (sreg->index == TEXTURE_TYPE_VOLUME));
                make_GLSL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                make_GLSL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
            } // else
        } // if

        // !!! FIXME: can TEXLDD set instruction_controls?
        // !!! FIXME: does the d3d bias value map directly to GLSL?
        const char *biassep = "";
        char bias[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDB)
        {
            biassep = ", ";
            make_GLSL_srcarg_string_w(ctx, 0, bias, sizeof (bias));
        } // if

        switch ((const TextureType) sreg->index)
        {
            case TEXTURE_TYPE_2D:
                if (ctx->instruction_controls == CONTROL_TEXLDP)
                {
                    funcname = "texture2DProj";
                    make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
                } // if
                else  // texld/texldb
                {
                    funcname = "texture2D";
                    make_GLSL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
                } // else
                break;
            case TEXTURE_TYPE_CUBE:
                if (ctx->instruction_controls == CONTROL_TEXLDP)
                    fail(ctx, "TEXLDP on a cubemap");  // !!! FIXME: is this legal?
                funcname = "textureCube";
                make_GLSL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                break;
            case TEXTURE_TYPE_VOLUME:
                if (ctx->instruction_controls == CONTROL_TEXLDP)
                {
                    funcname = "texture3DProj";
                    make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
                } // if
                else  // texld/texldb
                {
                    funcname = "texture3D";
                    make_GLSL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                } // else
                break;
            default:
                fail(ctx, "unknown texture type");
                return;
        } // switch

        assert(!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum));
        char swiz_str[6] = { '\0' };
        make_GLSL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 samp_arg->swizzle, ctx->dest_arg.writemask);

        char code[128];
        if (texldd)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "%sGrad(%s, %s, %s, %s)%s", funcname,
                                     src1, src0, src2, src3, swiz_str);
        } // if
        else
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "%s(%s, %s%s%s)%s", funcname,
                                     src1, src0, biassep, bias, swiz_str);
        } // else

        output_line(ctx, "%s", code);
    } // else
}